

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynBreak * ParseBreak(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  SynNumber *pSVar2;
  undefined4 extraout_var;
  SynBreak *this;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_break) {
    ctx->currentLexeme = begin + 1;
    pSVar2 = ParseNumber(ctx);
    anon_unknown.dwarf_16d1cf::CheckConsume
              (ctx,lex_semicolon,"ERROR: break statement must be followed by \';\' or a constant");
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    this = (SynBreak *)CONCAT44(extraout_var,iVar1);
    if (ctx->currentLexeme <= ctx->firstLexeme) {
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
    SynBase::SynBase((SynBase *)this,0x24,begin,ctx->currentLexeme + -1);
    (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f7d90;
    this->number = pSVar2;
  }
  else {
    this = (SynBreak *)0x0;
  }
  return this;
}

Assistant:

SynBreak* ParseBreak(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_break))
	{
		// Optional
		SynNumber *node = ParseNumber(ctx);

		CheckConsume(ctx, lex_semicolon, "ERROR: break statement must be followed by ';' or a constant");

		return new (ctx.get<SynBreak>()) SynBreak(start, ctx.Previous(), node);
	}

	return NULL;
}